

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O1

bool __thiscall
obs::safe_list<obs::slot<void_(int)>_>::iterator::operator!=(iterator *this,iterator *other)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  bool bVar2;
  
  __mutex = (pthread_mutex_t *)this->m_list;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if ((this->m_node == (node *)0x0) || (other->m_node == (node *)0x0)) {
      bVar2 = false;
    }
    else {
      bVar2 = this->m_node != other->m_node->next;
    }
    pthread_mutex_unlock(__mutex);
    return bVar2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool operator!=(const iterator& other) const {
      std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
      if (m_node && other.m_node)
        return (m_node != other.m_node->next);
      else
        return false;
    }